

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

void dxil_spv_converter_add_local_root_descriptor_table
               (dxil_spv_converter converter,dxil_spv_resource_class resource_class,
               uint register_space,uint register_index,uint num_descriptors_in_range,
               uint offset_in_heap)

{
  value_type local_7c;
  dxil_spv_resource_class local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  undefined1 local_48 [32];
  pointer local_28;
  pointer pDStack_20;
  pointer local_18;
  
  local_7c.type = resource_class;
  local_7c.register_space = register_space;
  local_7c.register_index = register_index;
  local_7c.num_descriptors_in_range = num_descriptors_in_range;
  local_7c.offset_in_heap = offset_in_heap;
  if (converter->active_table == true) {
    std::
    vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
    ::push_back(&converter->local_entries,&local_7c);
  }
  else {
    local_48._8_4_ = 0;
    local_48._12_4_ = 0;
    local_48._16_4_ = SRV;
    local_48._20_4_ = 0;
    local_48._24_4_ = 0;
    local_28 = (pointer)0x0;
    pDStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    local_48._0_4_ = Table;
    local_48._4_4_ = 0;
    local_68 = resource_class;
    local_64 = register_space;
    local_60 = register_index;
    local_5c = num_descriptors_in_range;
    local_58 = offset_in_heap;
    std::
    vector<dxil_spv::DescriptorTableEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>>
    ::_M_assign_aux<dxil_spv::DescriptorTableEntry_const*>
              ((vector<dxil_spv::DescriptorTableEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>>
                *)&local_28,&local_68);
    std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>::
    emplace_back<LocalRootParameter>
              (&converter->local_root_parameters,(LocalRootParameter *)local_48);
    std::
    _Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
    ::~_Vector_base((_Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                     *)&local_28);
  }
  return;
}

Assistant:

void dxil_spv_converter_add_local_root_descriptor_table(dxil_spv_converter converter,
                                                        dxil_spv_resource_class resource_class,
                                                        unsigned register_space,
                                                        unsigned register_index,
                                                        unsigned num_descriptors_in_range,
                                                        unsigned offset_in_heap)
{
	DescriptorTableEntry entry = {};
	entry.type = ResourceClass(resource_class);
	entry.register_space = register_space;
	entry.register_index = register_index;
	entry.num_descriptors_in_range = num_descriptors_in_range;
	entry.offset_in_heap = offset_in_heap;

	if (converter->active_table)
		converter->local_entries.push_back(entry);
	else
	{
		LocalRootParameter param = {};
		param.type = LocalRootParameterType::Table;
		param.table_entries = { entry };
		converter->local_root_parameters.push_back(std::move(param));
	}
}